

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::MultiplyPropagateStatistics::Operation<short,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  bool bVar9;
  short sVar10;
  int iVar11;
  Value local_70;
  
  sVar2 = NumericStats::GetMin<short>(lstats);
  sVar3 = NumericStats::GetMax<short>(lstats);
  sVar4 = NumericStats::GetMin<short>(rstats);
  sVar5 = NumericStats::GetMax<short>(rstats);
  iVar6 = 0x7fff;
  iVar8 = 0x8000;
  bVar1 = true;
  do {
    bVar7 = bVar1;
    sVar10 = sVar4;
    bVar1 = true;
    do {
      bVar9 = bVar1;
      iVar11 = (int)sVar10 * (int)sVar2;
      if (iVar11 - 10000U < 0xffffb1e1) goto LAB_010ac43a;
      if ((short)iVar11 <= (short)iVar6) {
        iVar6 = iVar11;
      }
      if ((short)iVar8 <= (short)iVar11) {
        iVar8 = iVar11;
      }
      sVar10 = sVar5;
      bVar1 = false;
    } while (bVar9);
    sVar2 = sVar3;
    bVar1 = false;
  } while (bVar7);
  Value::Numeric(&local_70,type,(long)(short)iVar6);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,(long)(short)iVar8);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
LAB_010ac43a:
  return iVar11 - 10000U < 0xffffb1e1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}